

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnInitExprRefFunc
          (BinaryReaderIR *this,Index index,Index func_index)

{
  intrusive_list<wabt::Expr> *this_00;
  Var local_98;
  unique_ptr<wabt::VarExpr<(wabt::ExprType)35>,_std::default_delete<wabt::VarExpr<(wabt::ExprType)35>_>_>
  local_50;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_48;
  undefined1 local_40 [8];
  Location loc;
  Index func_index_local;
  Index index_local;
  BinaryReaderIR *this_local;
  
  loc.field_1.field_0.last_column = func_index;
  loc.field_1._12_4_ = index;
  GetLocation((Location *)local_40,this);
  this_00 = this->current_init_expr_;
  Var::Var(&local_98,loc.field_1.field_0.last_column,(Location *)local_40);
  MakeUnique<wabt::VarExpr<(wabt::ExprType)35>,wabt::Var,wabt::Location&>
            ((wabt *)&local_50,&local_98,(Location *)local_40);
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::VarExpr<(wabt::ExprType)35>,std::default_delete<wabt::VarExpr<(wabt::ExprType)35>>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_48,&local_50);
  intrusive_list<wabt::Expr>::push_back(this_00,&local_48);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_48);
  std::
  unique_ptr<wabt::VarExpr<(wabt::ExprType)35>,_std::default_delete<wabt::VarExpr<(wabt::ExprType)35>_>_>
  ::~unique_ptr(&local_50);
  Var::~Var(&local_98);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnInitExprRefFunc(Index index, Index func_index) {
  Location loc = GetLocation();
  current_init_expr_->push_back(
      MakeUnique<RefFuncExpr>(Var(func_index, loc), loc));
  return Result::Ok;
}